

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

value * mjs::accept<mjs::interpreter::impl>(value *__return_storage_ptr__,expression *e,impl *v)

{
  int iVar1;
  impl *v_local;
  expression *e_local;
  
  iVar1 = (*(e->super_syntax_node)._vptr_syntax_node[3])();
  switch(iVar1) {
  case 0:
    interpreter::impl::operator()(__return_storage_ptr__,v,(identifier_expression *)e);
    break;
  case 1:
    interpreter::impl::operator()(__return_storage_ptr__,v,(this_expression *)e);
    break;
  case 2:
    interpreter::impl::operator()(__return_storage_ptr__,v,(literal_expression *)e);
    break;
  case 3:
    interpreter::impl::operator()(__return_storage_ptr__,v,(array_literal_expression *)e);
    break;
  case 4:
    interpreter::impl::operator()(__return_storage_ptr__,v,(object_literal_expression *)e);
    break;
  case 5:
    interpreter::impl::operator()(__return_storage_ptr__,v,(regexp_literal_expression *)e);
    break;
  case 6:
    interpreter::impl::operator()(__return_storage_ptr__,v,(call_expression *)e);
    break;
  case 7:
    interpreter::impl::operator()(__return_storage_ptr__,v,(prefix_expression *)e);
    break;
  case 8:
    interpreter::impl::operator()(__return_storage_ptr__,v,(postfix_expression *)e);
    break;
  case 9:
    interpreter::impl::operator()(__return_storage_ptr__,v,(binary_expression *)e);
    break;
  case 10:
    interpreter::impl::operator()(__return_storage_ptr__,v,(conditional_expression *)e);
    break;
  case 0xb:
    interpreter::impl::operator()(__return_storage_ptr__,v,(function_expression *)e);
    break;
  default:
    __assert_fail("!\"Not implemented\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x1e4,
                  "auto mjs::accept(const expression &, Visitor &) [Visitor = mjs::interpreter::impl]"
                 );
  }
  return __return_storage_ptr__;
}

Assistant:

auto accept(const expression& e, Visitor& v) {
    switch (e.type()) {
    case expression_type::identifier:       return v(static_cast<const identifier_expression&>(e));
    case expression_type::this_:            return v(static_cast<const this_expression&>(e));
    case expression_type::literal:          return v(static_cast<const literal_expression&>(e));
    case expression_type::array_literal:    return v(static_cast<const array_literal_expression&>(e));
    case expression_type::object_literal:   return v(static_cast<const object_literal_expression&>(e));
    case expression_type::regexp_literal:   return v(static_cast<const regexp_literal_expression&>(e));
    case expression_type::call:             return v(static_cast<const call_expression&>(e));
    case expression_type::prefix:           return v(static_cast<const prefix_expression&>(e));
    case expression_type::postfix:          return v(static_cast<const postfix_expression&>(e));
    case expression_type::binary:           return v(static_cast<const binary_expression&>(e));
    case expression_type::conditional:      return v(static_cast<const conditional_expression&>(e));
    case expression_type::function:         return v(static_cast<const function_expression&>(e));
    }
    assert(!"Not implemented");
    return v(e);
}